

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_Hatch::IsValid(ON_Hatch *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_HatchLoop **ppOVar2;
  uint local_2c;
  int i;
  int count;
  bool rc;
  ON_TextLog *text_log_local;
  ON_Hatch *this_local;
  
  i._3_1_ = ON_Plane::IsValid(&this->m_plane);
  if (i._3_1_) {
    iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops);
    for (local_2c = 0; (int)local_2c < iVar1; local_2c = local_2c + 1) {
      ppOVar2 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,local_2c);
      if (*ppOVar2 == (ON_HatchLoop *)0x0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"Loop[%d] is nullptr\n",(ulong)local_2c);
        }
        return false;
      }
      if (i._3_1_ != false) {
        ppOVar2 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,local_2c);
        i._3_1_ = ON_HatchLoop::IsValid(*ppOVar2,text_log);
      }
      if (i._3_1_ == false) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"Loop[%d] is not valid\n",(ulong)local_2c);
        }
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"Plane is not valid\n");
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Hatch::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_plane.IsValid();
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Plane is not valid\n");
    return false;
  }
  // 18 June 2012 - Lowell - Added loop self-intersection and 
  // intersecting other loops tests
  int count = m_loops.Count();
  for(int i = 0; i < count; i++)
  {
    if(m_loops[i] == 0)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is nullptr\n", i);
      return false;
    }
    if(rc)
      rc = m_loops[i]->IsValid( text_log);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is not valid\n", i);
      return false;
    }
  }
  

  return true;
}